

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O3

TaskExecutionResult __thiscall
duckdb::HashAggregateDistinctFinalizeTask::ExecuteTask
          (HashAggregateDistinctFinalizeTask *this,TaskExecutionMode mode)

{
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  TaskExecutionResult TVar2;
  Event *this_00;
  ulong grouping_idx;
  
  grouping_idx = this->grouping_idx;
  if (grouping_idx <
      (ulong)(((long)(this->op->groupings).
                     super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                     .
                     super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->op->groupings).
                     super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                     .
                     super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    do {
      TVar2 = AggregateDistinctGrouping(this,grouping_idx);
      if (TVar2 == TASK_BLOCKED) {
        return TASK_BLOCKED;
      }
      this->aggregation_idx = 0;
      this->payload_idx = 0;
      this->next_payload_idx = 0;
      _Var1._M_head_impl =
           (this->local_sink_state).
           super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
           .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
      (this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
      if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
      }
      grouping_idx = this->grouping_idx + 1;
      this->grouping_idx = grouping_idx;
    } while (grouping_idx <
             (ulong)(((long)(this->op->groupings).
                            super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            .
                            super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->op->groupings).
                            super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            .
                            super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7));
  }
  this_00 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  Event::FinishTask(this_00);
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult HashAggregateDistinctFinalizeTask::ExecuteTask(TaskExecutionMode mode) {
	for (; grouping_idx < op.groupings.size(); grouping_idx++) {
		auto res = AggregateDistinctGrouping(grouping_idx);
		if (res == TaskExecutionResult::TASK_BLOCKED) {
			return res;
		}
		D_ASSERT(res == TaskExecutionResult::TASK_FINISHED);
		aggregation_idx = 0;
		payload_idx = 0;
		next_payload_idx = 0;
		local_sink_state = nullptr;
	}
	event->FinishTask();
	return TaskExecutionResult::TASK_FINISHED;
}